

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O2

void __thiscall leveldb::TestState::Change(TestState *this,ReaderState s)

{
  std::mutex::lock(&(this->mu_).mu_);
  this->state_ = s;
  std::condition_variable::notify_one();
  pthread_mutex_unlock((pthread_mutex_t *)&this->mu_);
  return;
}

Assistant:

LOCKS_EXCLUDED(mu_) {
    mu_.Lock();
    state_ = s;
    state_cv_.Signal();
    mu_.Unlock();
  }